

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O2

bool __thiscall
tinyusdz::Attribute::get<tinyusdz::value::texcoord2d>
          (Attribute *this,double t,texcoord2d *dst,TimeSampleInterpolationType tinterp)

{
  double dVar1;
  bool bVar2;
  value_type *pvVar3;
  optional<tinyusdz::value::texcoord2d> v;
  optional<tinyusdz::value::texcoord2d> local_58;
  optional<tinyusdz::value::texcoord2d> local_40;
  
  if (dst == (texcoord2d *)0x0) {
    return false;
  }
  if (NAN(t)) {
    bVar2 = primvar::PrimVar::has_value(&this->_var);
    if (bVar2) {
      primvar::PrimVar::get_value<tinyusdz::value::texcoord2d>(&local_58,&this->_var);
      local_40.has_value_ = local_58.has_value_;
      if (local_58.has_value_ != false) {
        local_40.contained.data.__align = local_58.contained.data.__align;
        local_40.contained._8_8_ = local_58.contained._8_8_;
        pvVar3 = nonstd::optional_lite::optional<tinyusdz::value::texcoord2d>::value(&local_40);
        dVar1 = pvVar3->t;
        dst->s = pvVar3->s;
        dst->t = dVar1;
        return true;
      }
    }
  }
  if ((this->_var)._ts._samples.
      super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      (this->_var)._ts._samples.
      super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    bVar2 = get_value<tinyusdz::value::texcoord2d>(this,dst);
  }
  else {
    bVar2 = primvar::PrimVar::get_interpolated_value<tinyusdz::value::texcoord2d>
                      (&this->_var,t,tinterp,dst);
  }
  return bVar2;
}

Assistant:

bool get(const double t, T *dst,
           value::TimeSampleInterpolationType tinterp =
           value::TimeSampleInterpolationType::Linear) const {
    if (!dst) {
      return false;
    }

    if (value::TimeCode(t).is_default()) {
      if (has_value()) {
        nonstd::optional<T> v = _var.get_value<T>();
        if (v) {
          (*dst) = v.value();
          return true;
        }
      }
    }

    if (has_timesamples()) {
      return _var.get_interpolated_value(t, tinterp, dst);
    }

    // try to get 'defaut' value
    return get_value(dst);
  }